

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::addSourceFilterToEndpoint
          (CommonCore *this,string_view filter,string_view endpoint)

{
  ActionMessage link;
  ActionMessage AStack_e8;
  
  ActionMessage::ActionMessage(&AStack_e8,cmd_filter_link);
  ActionMessage::name(&AStack_e8,filter);
  ActionMessage::setStringData(&AStack_e8,endpoint);
  BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_e8);
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void CommonCore::addSourceFilterToEndpoint(std::string_view filter, std::string_view endpoint)
{
    ActionMessage link(CMD_FILTER_LINK);
    link.name(filter);
    link.setStringData(endpoint);
    addActionMessage(std::move(link));
}